

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long lVar9;
  byte *pbVar10;
  byte *__s;
  ulong uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  
  iVar5 = 0x32;
  if (1 < (ulong)((long)end - (long)*src)) {
    puVar3 = *src;
    lVar9 = 0;
    puVar13 = (uint8_t *)0x0;
    do {
      uVar12 = (long)puVar13 * 0x100;
      *src = puVar3 + lVar9 + 1;
      uVar11 = (ulong)puVar3[lVar9];
      puVar13 = (uint8_t *)(uVar12 + uVar11);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    iVar5 = 0x32;
    if ((puVar13 <= end + (-2 - (long)puVar3)) && (puVar13 != (uint8_t *)0x0)) {
      uVar12 = uVar12 | uVar11;
      iVar5 = 0;
      do {
        puVar8 = *src;
        *src = puVar8 + 1;
        if (puVar3 + (uVar12 - (long)puVar8) + 1 < (uint8_t *)0x2) {
LAB_00119cfb:
          bVar4 = false;
          iVar5 = 0x32;
        }
        else {
          uVar1 = *puVar8;
          puVar7 = puVar3 + (uVar12 - (long)*src) + 2;
          lVar9 = -2;
          puVar8 = (uint8_t *)0x0;
          pbVar10 = *src;
          do {
            uVar11 = (long)puVar8 * 0x100;
            __s = pbVar10 + 1;
            *src = __s;
            bVar2 = *pbVar10;
            puVar8 = (uint8_t *)(bVar2 + uVar11);
            puVar7 = puVar7 + -1;
            lVar9 = lVar9 + 1;
            pbVar10 = __s;
          } while (lVar9 != 0);
          if (puVar7 < puVar8) goto LAB_00119cfb;
          if (uVar1 == '\0') {
            pvVar6 = memchr(__s,0,(size_t)puVar8);
            if (pvVar6 == (void *)0x0) {
              name->base = __s;
              name->len = (size_t)puVar8;
              goto LAB_00119d09;
            }
            iVar5 = 0x2f;
            bVar4 = false;
          }
          else {
LAB_00119d09:
            *src = __s + (uVar11 | bVar2);
            bVar4 = true;
          }
        }
      } while ((bVar4) && (puVar3 + (long)(puVar13 + 2) != *src));
    }
  }
  return iVar5;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}